

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void JudgePart(char *buf,int start_line,int line_num,vector<char,_std::allocator<char>_> *res)

{
  long lVar1;
  int i;
  char *pcVar2;
  short sVar3;
  long lVar4;
  
  if (0 < line_num) {
    pcVar2 = buf + start_line * 6000;
    lVar1 = (long)start_line;
    do {
      if ((long)features_num < 1) {
        sVar3 = 0;
      }
      else {
        lVar4 = 0;
        sVar3 = 0;
        do {
          sVar3 = sVar3 + (pcVar2[2] + -0x30) *
                          means_sub.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4];
          pcVar2 = pcVar2 + 6;
          lVar4 = lVar4 + 1;
        } while (features_num != lVar4);
      }
      (res->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar1] = (byte)((ushort)(sVar3 + C) >> 0xf) ^ 0x31;
      lVar1 = lVar1 + 1;
    } while (lVar1 < line_num + start_line);
  }
  return;
}

Assistant:

void JudgePart (char * buf, int start_line, int line_num, vector<char> & res) {

#ifdef NO_NEON
    int end_line = start_line + line_num;
    buf = buf + start_line * 6000;
    for (int i = start_line; i < end_line; i++) {
        short norm_delta = 0;
        for (int j = 0; j < features_num; j++) {
            short ret =  (*(buf + 2) - '0');
            norm_delta += means_sub[j] * ret;
            buf += 6;
        }
        norm_delta = norm_delta + C;
        res[i] = norm_delta < 0? '0': '1';
    }
#else

    int N = features_num;
    int i = 0;
    int end_line = start_line + line_num;


    for (i = start_line; i + IB < end_line; i += IB) {
        int16x8_t temp[IB];
        for (int ii = 0; ii < IB; ii++) {
            temp[ii] = vdupq_n_s16(0);
        }


        for (int k = 0; k < N; k += 8) {

            int16x8_t v_b = vld1q_s16(&means_sub[k]);

            int16x8_t v_a[IB];
            for (int ii = 0; ii < IB; ii++) {
                char * start_buf = buf + (i + ii) * 6000 + k * 6;

                short ret[8];
                ret[0] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[1] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[2] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[3] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[4] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[5] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[6] = (*(start_buf + 2) - '0');
                start_buf += 6;
                ret[7] = (*(start_buf + 2) - '0');

                v_a[ii] = vld1q_s16(ret);

                temp[ii] = vmlaq_s16(temp[ii], v_a[ii], v_b);

            }



        }


        for (int ii = 0; ii < IB; ii++) {
            int16x8_t temp_c = temp[ii];
            short tmp = temp_c[0] + temp_c[1] + temp_c[2] + temp_c[3] + temp_c[4] + temp_c[5] + temp_c[6] + temp_c[7];

            res[i + ii] = (tmp + C < 0)? '0': '1';

        }


    }



#endif
}